

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O1

ResamplerStage *
SRCTools::SincResampler::createSincResampler
          (double inputFrequency,double outputFrequency,double passbandFrequency,
          double stopbandFrequency,double dbSNR,uint maxUpsampleFactor)

{
  FIRCoefficient *kernel;
  FIRResampler *this;
  uint kernelLength;
  double dVar1;
  double dVar2;
  double dVar3;
  uint upsampleFactor;
  double downsampleFactor;
  uint local_34;
  double local_30;
  
  Utils::computeResampleFactors
            (&local_34,&local_30,inputFrequency,outputFrequency,maxUpsampleFactor);
  dVar1 = 1.0 / (inputFrequency * (double)local_34);
  dVar3 = passbandFrequency * dVar1;
  dVar1 = dVar1 * stopbandFrequency;
  dVar2 = ceil((dbSNR + -8.0) / ((dVar1 - dVar3) * 14.357078426905355));
  kernelLength = (uint)(long)dVar2 + 1;
  kernel = (FIRCoefficient *)operator_new__((ulong)kernelLength * 4);
  KaizerWindow::windowedSinc
            (kernel,(uint)(long)dVar2,(dVar3 + dVar1) * 0.5,(dbSNR + -8.7) * 0.1102,(double)local_34
            );
  this = (FIRResampler *)operator_new(0x48);
  FIRResampler::FIRResampler(this,local_34,local_30,kernel,kernelLength);
  operator_delete__(kernel);
  return &this->super_ResamplerStage;
}

Assistant:

ResamplerStage *SincResampler::createSincResampler(const double inputFrequency, const double outputFrequency, const double passbandFrequency, const double stopbandFrequency, const double dbSNR, const unsigned int maxUpsampleFactor) {
	unsigned int upsampleFactor;
	double downsampleFactor;
	computeResampleFactors(upsampleFactor, downsampleFactor, inputFrequency, outputFrequency, maxUpsampleFactor);
	double baseSamplePeriod = 1.0 / (inputFrequency * upsampleFactor);
	double fp = passbandFrequency * baseSamplePeriod;
	double fs = stopbandFrequency * baseSamplePeriod;
	double fc = 0.5 * (fp + fs);
	double beta = KaizerWindow::estimateBeta(dbSNR);
	unsigned int order = KaizerWindow::estimateOrder(dbSNR, fp, fs);
	const unsigned int kernelLength = order + 1;

#ifdef SRCTOOLS_SINC_RESAMPLER_DEBUG_LOG
	std::clog << "FIR: " << upsampleFactor << "/" << downsampleFactor << ", N=" << kernelLength << ", NPh=" << kernelLength / double(upsampleFactor) << ", C=" << 0.5 / fc << ", fp=" << fp << ", fs=" << fs << ", M=" << maxUpsampleFactor << std::endl;
#endif

	FIRCoefficient *windowedSincKernel = new FIRCoefficient[kernelLength];
	KaizerWindow::windowedSinc(windowedSincKernel, order, fc, beta, upsampleFactor);
	ResamplerStage *windowedSincStage = new FIRResampler(upsampleFactor, downsampleFactor, windowedSincKernel, kernelLength);
	delete[] windowedSincKernel;
	return windowedSincStage;
}